

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O0

uint __thiscall
QFragmentMapData<QTextBlockData>::previous(QFragmentMapData<QTextBlockData> *this,uint n)

{
  QTextBlockData *pQVar1;
  uint in_ESI;
  QFragmentMapData<QTextBlockData> *in_RDI;
  bool bVar2;
  uint y;
  uint local_18;
  uint local_4;
  
  if (in_ESI == 0) {
    root(in_RDI);
    local_4 = maximum(in_RDI,in_ESI);
  }
  else {
    pQVar1 = F(in_RDI,in_ESI);
    if ((pQVar1->super_QFragment<3>).left == 0) {
      pQVar1 = F(in_RDI,in_ESI);
      local_18 = (pQVar1->super_QFragment<3>).parent;
      while( true ) {
        pQVar1 = F(in_RDI,in_ESI);
        bVar2 = false;
        if ((pQVar1->super_QFragment<3>).parent != 0) {
          pQVar1 = F(in_RDI,local_18);
          bVar2 = in_ESI == (pQVar1->super_QFragment<3>).left;
        }
        local_4 = local_18;
        if (!bVar2) break;
        in_ESI = local_18;
        pQVar1 = F(in_RDI,local_18);
        local_18 = (pQVar1->super_QFragment<3>).parent;
      }
    }
    else {
      pQVar1 = F(in_RDI,in_ESI);
      local_4 = (pQVar1->super_QFragment<3>).left;
      while (pQVar1 = F(in_RDI,local_4), (pQVar1->super_QFragment<3>).right != 0) {
        pQVar1 = F(in_RDI,local_4);
        local_4 = (pQVar1->super_QFragment<3>).right;
      }
    }
  }
  return local_4;
}

Assistant:

uint QFragmentMapData<Fragment>::previous(uint n) const {
    if (!n)
        return maximum(root());

    if (F(n).left) {
        n = F(n).left;
        while (F(n).right)
            n = F(n).right;
    } else {
        uint y = F(n).parent;
        while (F(n).parent && n == F(y).left) {
            n = y;
            y = F(y).parent;
        }
        n = y;
    }
    return n;
}